

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::collate(Config *this,string *parameter)

{
  element_type *peVar1;
  uint uVar2;
  long lVar3;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  string local_50;
  
  if (parameter->_M_string_length == 0) {
    peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    do {
      lVar3 = std::__cxx11::string::find((char)parameter,0x2c);
      std::__cxx11::string::substr((ulong)&n,(ulong)parameter);
      if (n._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"--collate: trailing comma",&local_71);
        usage(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar2 = QUtil::string_to_uint(n._M_dataplus._M_p);
      local_50._M_dataplus._M_p = (pointer)(ulong)uVar2;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&peVar1->collate,(unsigned_long *)&local_50);
      std::__cxx11::string::~string((string *)&n);
    } while (lVar3 != -1);
    peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(peVar1->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data + 8)) {
      return this;
    }
  }
  n._M_dataplus._M_p = (pointer)0x1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&peVar1->collate,(unsigned_long *)&n);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::collate(std::string const& parameter)
{
    if (parameter.empty()) {
        o.m->collate.push_back(1);
        return this;
    }
    size_t pos = 0;
    // Parse a,b,c
    while (true) {
        auto end = parameter.find(',', pos);
        auto n = parameter.substr(pos, end);
        if (n.empty()) {
            usage("--collate: trailing comma");
        }
        o.m->collate.push_back(QIntC::to_size(QUtil::string_to_uint(n.c_str())));
        if (end == std::string::npos) {
            break;
        }
        pos = end + 1;
    }
    if (o.m->collate.empty()) {
        o.m->collate.push_back(1);
    }
    return this;
}